

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O0

void dirSAVECDTFull(path *cdtname)

{
  bool bVar1;
  int local_ac;
  byte local_a8 [4];
  aint i;
  byte palette [17];
  bool local_88 [8];
  bool opt [19];
  int local_68 [2];
  aint args [19];
  char *argerr;
  path *cdtname_local;
  
  stack0xffffffffffffffe8 =
       "[SAVECDT] Invalid args. SAVECDT FULL <cdtname>[,<startaddr>[,<screenmode>[,<border>[,<ink0>...<ink15>]]]]"
  ;
  memset(local_68,0,0x4c);
  local_68[0] = StartAddress;
  local_68[1] = 0xff;
  local_88[0] = false;
  local_88[1] = true;
  local_88[2] = true;
  local_88[3] = true;
  local_88[4] = true;
  local_88[5] = true;
  local_88[6] = true;
  local_88[7] = true;
  opt[0] = true;
  opt[1] = true;
  opt[2] = true;
  opt[3] = true;
  opt[4] = true;
  opt[5] = true;
  opt[6] = true;
  opt[7] = true;
  opt[8] = true;
  opt[9] = true;
  opt[10] = true;
  bVar1 = anyComma(&lp);
  if ((!bVar1) ||
     (bVar1 = getIntArguments<19>(&lp,(aint (*) [19])local_68,(bool (*) [19])local_88), bVar1)) {
    if (local_68[1] == 0xff) {
      SaveCDT_Snapshot(cdtname,local_68[0]);
    }
    else {
      for (local_ac = 0; local_ac < 0x11; local_ac = local_ac + 1) {
        local_a8[local_ac] = (byte)local_68[local_ac + 2];
      }
      SaveCDT_SnapshotWithPalette(cdtname,local_68[0],(byte)local_68[1],local_a8);
    }
  }
  else {
    Error("[SAVECDT] Invalid args. SAVECDT FULL <cdtname>[,<startaddr>[,<screenmode>[,<border>[,<ink0>...<ink15>]]]]"
          ,lp,SUPPRESS);
  }
  return;
}

Assistant:

static void dirSAVECDTFull(const std::filesystem::path & cdtname) {
	constexpr const char* argerr = "[SAVECDT] Invalid args. SAVECDT FULL <cdtname>[,<startaddr>[,<screenmode>[,<border>[,<ink0>...<ink15>]]]]";

	aint args[] = {
		StartAddress,
		0xFF, 0, // mode, border
		0, 0, 0, 0, 0, 0, 0, 0, // palette
		0, 0, 0, 0, 0, 0, 0, 0,
	};

	bool opt[] = {
		false,	// this is used only when comma was parsed after cdtname => not optional then
		true, true,
		true, true, true, true, true, true, true, true,
		true, true, true, true, true, true, true, true,
	};

	if (anyComma(lp) && !getIntArguments<19>(lp, args, opt)) {
		Error(argerr, lp, SUPPRESS); return;
	}

	if (args[1] != 0xFF) {
		byte palette[17];
		for (aint i = 0; i < 17; ++i) {
			palette[i] = args[2 + i];
		}

		SaveCDT_SnapshotWithPalette(cdtname, args[0], args[1], palette);
	}
	else {
		SaveCDT_Snapshot(cdtname, args[0]);
	}
}